

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_common_v1.hpp
# Opt level: O2

void __thiscall LASwavepacket13::pack(LASwavepacket13 *this,U8 *item)

{
  U64 UVar1;
  
  *(int *)item = (int)this->offset;
  UVar1 = this->offset;
  item[4] = (U8)(UVar1 >> 0x20);
  item[5] = (U8)(UVar1 >> 0x28);
  item[6] = (U8)(UVar1 >> 0x30);
  item[7] = (U8)(UVar1 >> 0x38);
  *(U32 *)(item + 8) = this->packet_size;
  *(U32I32F32 *)(item + 0xc) = this->return_point;
  *(U32I32F32 *)(item + 0x10) = this->x;
  *(U32I32F32 *)(item + 0x14) = this->y;
  *(U32I32F32 *)(item + 0x18) = this->z;
  return;
}

Assistant:

void inline pack(U8 *item)
  {
    // pack a LAS wavepacket into raw memory
    packU32((U32)(offset & 0xFFFFFFFF), item);
    packU32((U32)(offset >> 32), item+4);

    packU32(packet_size, item + 8);
    packU32(return_point.u32, item + 12);
    packU32(x.u32, item + 16);
    packU32(y.u32, item + 20);
    packU32(z.u32, item + 24);
  }